

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcEmbedTokenList::add_tok(CTcEmbedTokenList *this,CTcToken *tok)

{
  CTcTokenEle *pCVar1;
  CTcTokenizer *in_RSI;
  CTcTokenEle *in_RDI;
  CTcTokenEle *ele;
  CTcToken *in_stack_ffffffffffffffe0;
  CTcToken *in_stack_ffffffffffffffe8;
  
  CTcTokenizer::copytok(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pCVar1 = CTcTokenEle::getnxt((CTcTokenEle *)(in_RDI->super_CTcToken).text_);
  if (pCVar1 == (CTcTokenEle *)0x0) {
    pCVar1 = (CTcTokenEle *)operator_new(0x38);
    CTcTokenEle::CTcTokenEle(in_RDI);
    CTcTokenEle::setprv(pCVar1,(CTcTokenEle *)(in_RDI->super_CTcToken).text_);
    CTcTokenEle::setnxt((CTcTokenEle *)(in_RDI->super_CTcToken).text_,pCVar1);
  }
  pCVar1 = CTcTokenEle::getnxt((CTcTokenEle *)(in_RDI->super_CTcToken).text_);
  (in_RDI->super_CTcToken).text_ = (char *)pCVar1;
  *(int *)&(in_RDI->super_CTcToken).text_len_ = (int)(in_RDI->super_CTcToken).text_len_ + 1;
  return;
}

Assistant:

void add_tok(const CTcToken *tok)
    {
        /* fill in the write token */
        G_tok->copytok(wrt, tok);

        /* if this is the last item in the list, add another */
        if (wrt->getnxt() == 0)
        {
            CTcTokenEle *ele = new CTcTokenEle();
            ele->setprv(wrt);
            wrt->setnxt(ele);
        }

        /* advance the write pointer */
        wrt = wrt->getnxt();

        /* count it */
        ++cnt;
    }